

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

ParserResult *
Catch::Clara::Detail::convertInto<int>
          (ParserResult *__return_storage_ptr__,string *source,int *target)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ParseResultType local_200 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  int *target_local;
  string *source_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a8,(string *)source,_Var2);
  std::istream::operator>>((istream *)local_1a8,target);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    local_200[0] = Matched;
    BasicResult<Catch::Clara::ParseResultType>::ok<Catch::Clara::ParseResultType>
              (__return_storage_ptr__,local_200);
  }
  else {
    std::operator+(&local_1f8,"Unable to convert \'",source);
    std::operator+(&local_1d8,&local_1f8,"\' to destination type");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  local_200[1] = 1;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

ParserResult convertInto( std::string const& source, T& target ) {
                std::stringstream ss( source );
                ss >> target;
                if ( ss.fail() ) {
                    return ParserResult::runtimeError(
                        "Unable to convert '" + source +
                        "' to destination type" );
                } else {
                    return ParserResult::ok( ParseResultType::Matched );
                }
            }